

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

string * __thiscall
pbrt::MediumSample::ToString_abi_cxx11_(string *__return_storage_ptr__,MediumSample *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::MediumInteraction_const&,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,"[ MediumSample intr: %s Tmaj: %s ]",&this->intr,&this->Tmaj);
  return __return_storage_ptr__;
}

Assistant:

std::string MediumSample::ToString() const {
    return StringPrintf("[ MediumSample intr: %s Tmaj: %s ]", intr, Tmaj);
}